

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

int __thiscall
cmGlobalGenerator::Build
          (cmGlobalGenerator *this,int jobs,string *param_2,string *bindir,string *projectName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets,string *output,string *makeCommandCSTR,string *config,
          cmBuildOptions *buildOptions,bool verbose,cmDuration timeout,OutputOption outputflag,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *nativeOptions)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  int __errnum;
  uint uVar2;
  char *str;
  ulong uVar3;
  reference pvVar4;
  GeneratedMakeCommand *pGVar5;
  size_type sVar6;
  cmake *this_00;
  pointer command_00;
  cmState *this_01;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  rep_conflict local_328;
  __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
  local_320;
  string local_318;
  __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
  local_2f8;
  __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
  local_2f0;
  iterator command;
  string makeCommandStr;
  string local_2c0;
  rep_conflict local_2a0;
  cmListFileBacktrace local_298;
  allocator<char> local_279;
  string local_278;
  string local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_213;
  undefined1 local_212;
  allocator<char> local_211;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  iterator local_1e8;
  size_type local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  undefined1 local_1c0 [8];
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  cleanCommand;
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  makeCommand;
  string *outputPtr;
  string outputBuffer;
  string local_160 [4];
  int retVal;
  string local_140 [8];
  string realConfig;
  cmAlphaNum local_118;
  cmAlphaNum local_e8;
  undefined1 local_b8 [8];
  string err;
  undefined1 local_88 [8];
  cmWorkingDirectory workdir;
  bool hideconsole;
  bool verbose_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *targets_local;
  string *projectName_local;
  string *bindir_local;
  string *param_2_local;
  int jobs_local;
  cmGlobalGenerator *this_local;
  cmDuration timeout_local;
  
  workdir._39_1_ = verbose;
  workdir._38_1_ = cmSystemTools::GetRunCommandHideConsole();
  cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_88,bindir);
  std::__cxx11::string::operator+=((string *)output,"Change Dir: ");
  std::__cxx11::string::operator+=((string *)output,(string *)bindir);
  std::__cxx11::string::operator+=((string *)output,"\n");
  bVar1 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_88);
  if (bVar1) {
    cmSystemTools::SetRunCommandHideConsole((bool)(workdir._38_1_ & 1));
    cmAlphaNum::cmAlphaNum(&local_e8,"Failed to change directory: ");
    __errnum = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)local_88);
    str = strerror(__errnum);
    cmAlphaNum::cmAlphaNum(&local_118,str);
    cmStrCat<>((string *)local_b8,&local_e8,&local_118);
    cmSystemTools::Error((string *)local_b8);
    std::__cxx11::string::operator+=((string *)output,(string *)local_b8);
    std::__cxx11::string::operator+=((string *)output,"\n");
    timeout_local.__r._4_4_ = 1;
    realConfig.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_b8);
    goto LAB_0072b63f;
  }
  std::__cxx11::string::string(local_140,(string *)config);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    (*this->_vptr_cmGlobalGenerator[0x25])(local_160);
    std::__cxx11::string::operator=(local_140,local_160);
    std::__cxx11::string::~string(local_160);
  }
  outputBuffer.field_2._12_4_ = 0;
  cmSystemTools::SetRunCommandHideConsole(true);
  std::__cxx11::string::string((string *)&outputPtr);
  (*this->_vptr_cmGlobalGenerator[0x13])
            (&cleanCommand.
              super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this,makeCommandCSTR,projectName,
             bindir,targets,local_140,jobs,(byte)workdir._39_1_ & 1,buildOptions,nativeOptions);
  if ((outputflag == OUTPUT_PASSTHROUGH) &&
     (pvVar4 = std::
               vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
               ::back((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                       *)&cleanCommand.
                          super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage),
     ((pvVar4->super_GeneratedMakeCommand).RequiresOutputForward & 1U) != 0)) {
    outputflag = OUTPUT_FORWARD;
  }
  if ((buildOptions->Clean & 1U) == 0) {
LAB_0072b24a:
    std::__cxx11::string::string((string *)&command);
    std::__cxx11::string::operator+=((string *)output,"\nRun Build Command(s):");
    outputBuffer.field_2._12_4_ = 0;
    local_2f0._M_current =
         (GeneratedMakeCommand *)
         std::
         vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
         ::begin((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                  *)&cleanCommand.
                     super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      local_2f8._M_current =
           (GeneratedMakeCommand *)
           std::
           vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
           ::end((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                  *)&cleanCommand.
                     super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = __gnu_cxx::operator!=(&local_2f0,&local_2f8);
      if (!bVar1 || outputBuffer.field_2._12_4_ != 0) break;
      pGVar5 = &__gnu_cxx::
                __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
                ::operator->(&local_2f0)->super_GeneratedMakeCommand;
      detail::GeneratedMakeCommand::Printable_abi_cxx11_(&local_318,pGVar5);
      std::__cxx11::string::operator=((string *)&command,(string *)&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      local_320._M_current =
           (GeneratedMakeCommand *)
           std::
           vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
           ::end((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                  *)&cleanCommand.
                     super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = __gnu_cxx::operator!=(&local_2f0,&local_320);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)&command," && ");
      }
      std::__cxx11::string::operator+=((string *)output,(string *)&command);
      command_00 = __gnu_cxx::
                   __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
                   ::operator->(&local_2f0);
      local_328 = timeout.__r;
      bVar1 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)command_00,(string *)&outputPtr,(string *)&outputPtr,
                         (int *)(outputBuffer.field_2._M_local_buf + 0xc),(char *)0x0,outputflag,
                         timeout,Auto);
      if (!bVar1) {
        cmSystemTools::SetRunCommandHideConsole((bool)(workdir._38_1_ & 1));
        std::operator+(&local_348,"Generator: execution of make failed. Make command was: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&command
                      );
        cmSystemTools::Error(&local_348);
        std::__cxx11::string::~string((string *)&local_348);
        std::__cxx11::string::operator+=((string *)output,(string *)&outputPtr);
        std::operator+(&local_388,"\nGenerator: execution of make failed. Make command was: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&command
                      );
        std::operator+(&local_368,&local_388,"\n");
        std::__cxx11::string::operator+=((string *)output,(string *)&local_368);
        std::__cxx11::string::~string((string *)&local_368);
        std::__cxx11::string::~string((string *)&local_388);
        timeout_local.__r._4_4_ = 1;
        goto LAB_0072b5d7;
      }
      std::__cxx11::string::operator+=((string *)output,(string *)&outputPtr);
      __gnu_cxx::
      __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
      ::operator++(&local_2f0);
    }
    std::__cxx11::string::operator+=((string *)output,"\n");
    cmSystemTools::SetRunCommandHideConsole((bool)(workdir._38_1_ & 1));
    this_01 = cmake::GetState(this->CMakeInstance);
    bVar1 = cmState::UseWatcomWMake(this_01);
    if (((bVar1) && (outputBuffer.field_2._12_4_ == 0)) &&
       (lVar7 = std::__cxx11::string::find((char *)output,0xdea586), lVar7 != -1)) {
      outputBuffer.field_2._12_4_ = 1;
    }
    timeout_local.__r._4_4_ = outputBuffer.field_2._12_4_;
LAB_0072b5d7:
    realConfig.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)&command);
  }
  else {
    local_212 = 1;
    local_210 = &local_208;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"clean",&local_211);
    local_212 = 0;
    local_1e8 = &local_208;
    local_1e0 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_213);
    __l._M_len = local_1e0;
    __l._M_array = local_1e8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1d8,__l,&local_213);
    uVar2 = (uint)(byte)workdir._39_1_;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_238);
    (*this->_vptr_cmGlobalGenerator[0x13])
              (local_1c0,this,makeCommandCSTR,projectName,bindir,&local_1d8,local_140,jobs,uVar2 & 1
               ,buildOptions,&local_238);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_238);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1d8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_213);
    local_3e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8;
    do {
      local_3e8 = local_3e8 + -1;
      std::__cxx11::string::~string((string *)local_3e8);
    } while (local_3e8 != &local_208);
    std::allocator<char>::~allocator(&local_211);
    std::__cxx11::string::operator+=((string *)output,"\nRun Clean Command:");
    pGVar5 = &std::
              vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ::front((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                       *)local_1c0)->super_GeneratedMakeCommand;
    detail::GeneratedMakeCommand::Printable_abi_cxx11_(&local_258,pGVar5);
    std::__cxx11::string::operator+=((string *)output,(string *)&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::operator+=((string *)output,"\n");
    sVar6 = std::
            vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
            ::size((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                    *)local_1c0);
    if (sVar6 == 1) {
      pvVar4 = std::
               vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
               ::front((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                        *)local_1c0);
      local_2a0 = timeout.__r;
      bVar1 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)pvVar4,(string *)&outputPtr,(string *)&outputPtr,
                         (int *)(outputBuffer.field_2._M_local_buf + 0xc),(char *)0x0,outputflag,
                         timeout,Auto);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)output,(string *)&outputPtr);
        realConfig.field_2._12_4_ = 0;
      }
      else {
        cmSystemTools::SetRunCommandHideConsole((bool)(workdir._38_1_ & 1));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2c0,"Generator: execution of make clean failed.",
                   (allocator<char> *)(makeCommandStr.field_2._M_local_buf + 0xf));
        cmSystemTools::Error(&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(makeCommandStr.field_2._M_local_buf + 0xf));
        std::__cxx11::string::operator+=((string *)output,(string *)&outputPtr);
        std::__cxx11::string::operator+=
                  ((string *)output,"\nGenerator: execution of make clean failed.\n");
        timeout_local.__r._4_4_ = 1;
        realConfig.field_2._12_4_ = 1;
      }
    }
    else {
      this_00 = GetCMakeInstance(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,
                 "The generator did not produce exactly one command for the \'clean\' target",
                 &local_279);
      local_298.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_298.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace(&local_298);
      cmake::IssueMessage(this_00,INTERNAL_ERROR,&local_278,&local_298);
      cmListFileBacktrace::~cmListFileBacktrace(&local_298);
      std::__cxx11::string::~string((string *)&local_278);
      std::allocator<char>::~allocator(&local_279);
      timeout_local.__r._4_4_ = 1;
      realConfig.field_2._12_4_ = 1;
    }
    std::
    vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
    ::~vector((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
               *)local_1c0);
    if (realConfig.field_2._12_4_ == 0) goto LAB_0072b24a;
  }
  std::
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  ::~vector((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
             *)&cleanCommand.
                super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&outputPtr);
  std::__cxx11::string::~string(local_140);
LAB_0072b63f:
  cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_88);
  return timeout_local.__r._4_4_;
}

Assistant:

int cmGlobalGenerator::Build(
  int jobs, const std::string& /*unused*/, const std::string& bindir,
  const std::string& projectName, const std::vector<std::string>& targets,
  std::string& output, const std::string& makeCommandCSTR,
  const std::string& config, const cmBuildOptions& buildOptions, bool verbose,
  cmDuration timeout, cmSystemTools::OutputOption outputflag,
  std::vector<std::string> const& nativeOptions)
{
  bool hideconsole = cmSystemTools::GetRunCommandHideConsole();

  /**
   * Run an executable command and put the stdout in output.
   */
  cmWorkingDirectory workdir(bindir);
  output += "Change Dir: ";
  output += bindir;
  output += "\n";
  if (workdir.Failed()) {
    cmSystemTools::SetRunCommandHideConsole(hideconsole);
    std::string err = cmStrCat("Failed to change directory: ",
                               std::strerror(workdir.GetLastResult()));
    cmSystemTools::Error(err);
    output += err;
    output += "\n";
    return 1;
  }
  std::string realConfig = config;
  if (realConfig.empty()) {
    realConfig = this->GetDefaultBuildConfig();
  }

  int retVal = 0;
  cmSystemTools::SetRunCommandHideConsole(true);
  std::string outputBuffer;
  std::string* outputPtr = &outputBuffer;

  std::vector<GeneratedMakeCommand> makeCommand = this->GenerateBuildCommand(
    makeCommandCSTR, projectName, bindir, targets, realConfig, jobs, verbose,
    buildOptions, nativeOptions);

  // Workaround to convince some commands to produce output.
  if (outputflag == cmSystemTools::OUTPUT_PASSTHROUGH &&
      makeCommand.back().RequiresOutputForward) {
    outputflag = cmSystemTools::OUTPUT_FORWARD;
  }

  // should we do a clean first?
  if (buildOptions.Clean) {
    std::vector<GeneratedMakeCommand> cleanCommand =
      this->GenerateBuildCommand(makeCommandCSTR, projectName, bindir,
                                 { "clean" }, realConfig, jobs, verbose,
                                 buildOptions);
    output += "\nRun Clean Command:";
    output += cleanCommand.front().Printable();
    output += "\n";
    if (cleanCommand.size() != 1) {
      this->GetCMakeInstance()->IssueMessage(MessageType::INTERNAL_ERROR,
                                             "The generator did not produce "
                                             "exactly one command for the "
                                             "'clean' target");
      return 1;
    }
    if (!cmSystemTools::RunSingleCommand(cleanCommand.front().PrimaryCommand,
                                         outputPtr, outputPtr, &retVal,
                                         nullptr, outputflag, timeout)) {
      cmSystemTools::SetRunCommandHideConsole(hideconsole);
      cmSystemTools::Error("Generator: execution of make clean failed.");
      output += *outputPtr;
      output += "\nGenerator: execution of make clean failed.\n";

      return 1;
    }
    output += *outputPtr;
  }

  // now build
  std::string makeCommandStr;
  output += "\nRun Build Command(s):";

  retVal = 0;
  for (auto command = makeCommand.begin();
       command != makeCommand.end() && retVal == 0; ++command) {
    makeCommandStr = command->Printable();
    if (command != makeCommand.end()) {
      makeCommandStr += " && ";
    }

    output += makeCommandStr;
    if (!cmSystemTools::RunSingleCommand(command->PrimaryCommand, outputPtr,
                                         outputPtr, &retVal, nullptr,
                                         outputflag, timeout)) {
      cmSystemTools::SetRunCommandHideConsole(hideconsole);
      cmSystemTools::Error(
        "Generator: execution of make failed. Make command was: " +
        makeCommandStr);
      output += *outputPtr;
      output += "\nGenerator: execution of make failed. Make command was: " +
        makeCommandStr + "\n";

      return 1;
    }
    output += *outputPtr;
  }
  output += "\n";
  cmSystemTools::SetRunCommandHideConsole(hideconsole);

  // The OpenWatcom tools do not return an error code when a link
  // library is not found!
  if (this->CMakeInstance->GetState()->UseWatcomWMake() && retVal == 0 &&
      output.find("W1008: cannot open") != std::string::npos) {
    retVal = 1;
  }

  return retVal;
}